

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fcos_x86_64(CPUX86State *env)

{
  uint uVar1;
  double dVar2;
  floatx80 fVar3;
  undefined6 uStack_1e;
  double fptemp;
  CPUX86State *env_local;
  
  fVar3._10_6_ = 0;
  fVar3._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  dVar2 = floatx80_to_double(env,fVar3);
  if ((9.223372036854776e+18 < dVar2) || (dVar2 < -9.223372036854776e+18)) {
    env->fpus = env->fpus | 0x400;
  }
  else {
    uVar1 = env->fpstt;
    dVar2 = cos(dVar2);
    fVar3 = double_to_floatx80(env,dVar2);
    env->fpregs[uVar1].d.low = fVar3.low;
    *(ulong *)((long)(env->fpregs + uVar1) + 8) = CONCAT62(uStack_1e,fVar3.high);
    env->fpus = env->fpus & 0xfbff;
  }
  return;
}

Assistant:

void helper_fcos(CPUX86State *env)
{
    double fptemp = floatx80_to_double(env, ST0);

    if ((fptemp > MAXTAN) || (fptemp < -MAXTAN)) {
        env->fpus |= 0x400;
    } else {
        ST0 = double_to_floatx80(env, cos(fptemp));
        env->fpus &= ~0x400;  /* C2 <-- 0 */
        /* the above code is for |arg| < 2**63 only */
    }
}